

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColecoVision.cpp
# Opt level: O2

HalfCycles __thiscall
Coleco::Vision::ConcreteMachine::perform_machine_cycle
          (ConcreteMachine *this,PartialMachineCycle *cycle)

{
  Operation OVar1;
  pointer puVar2;
  bool bVar3;
  uint8_t uVar4;
  ushort uVar5;
  uint uVar6;
  ssize_t sVar7;
  uint uVar8;
  size_t sVar9;
  void *__buf;
  WrappedInt<HalfCycles> WVar10;
  HalfCycles rhs;
  unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar11;
  undefined1 local_40 [16];
  
  if (cycle->operation == ReadOpcode) {
    WVar10.length_ = 2;
  }
  else if (cycle->operation == Output) {
    WVar10.length_ = 0x3e;
    if ((~*cycle->address & 0xe0) != 0) {
      WVar10.length_ = 0;
    }
  }
  else {
    WVar10.length_ = 0;
  }
  rhs.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)
       ((cycle->length).super_WrappedInt<HalfCycles>.length_ + WVar10.length_);
  bVar3 = JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator+=
                    (&this->vdp_,rhs);
  if (bVar3) {
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
              ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
               local_40);
    bVar3 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line
                      ((TMS9918<(TI::TMS::Personality)0> *)local_40._8_8_);
    CPU::Z80::ProcessorBase::set_non_maskable_interrupt_line
              (&(this->z80_).super_ProcessorBase,bVar3,(HalfCycles)0x0);
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_40);
  }
  (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_ =
       (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_ +
       (long)rhs.super_WrappedInt<HalfCycles>.length_;
  OVar1 = cycle->operation;
  if (8 < (int)OVar1) {
    return (HalfCycles)WVar10.length_;
  }
  if (cycle->address == (ushort *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)*cycle->address;
  }
  if (Output < OVar1) {
    return (HalfCycles)WVar10.length_;
  }
  sVar9 = (long)&switchD_002e25b2::switchdataD_0045fed4 +
          (long)(int)(&switchD_002e25b2::switchdataD_0045fed4)[OVar1];
  uVar5 = (ushort)uVar6;
  switch(OVar1) {
  case ReadOpcode:
    if (uVar5 != 0) goto switchD_002e25b2_caseD_1;
    this->pc_zero_accesses_ = this->pc_zero_accesses_ + 1;
    break;
  case Read:
switchD_002e25b2_caseD_1:
    if (0x1fff < uVar5) {
      if ((-1 < (short)uVar5 & (this->super_game_module_).replace_ram) == 1) {
        uVar4 = (this->super_game_module_).ram[uVar6];
      }
      else if ((short)uVar5 < 0x6000) {
        if ((-1 < (short)uVar5) || (this->cartridge_address_limit_ < uVar5)) {
LAB_002e2810:
          *cycle->value = 0xff;
          return (HalfCycles)WVar10.length_;
        }
        if ((0xffbf < uVar5 & this->is_megacart_) == 1) {
          puVar2 = (this->cartridge_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          this->cartridge_pages_[1] =
               puVar2 + (ulong)((uVar6 & 0x3f) << 0xe) %
                        (ulong)((long)(this->cartridge_).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
        }
        uVar4 = *(uint8_t *)
                 (*(long *)((long)this->cartridge_pages_ + (ulong)(uVar6 >> 0xb & 8)) +
                 (ulong)(uVar6 & 0x3fff));
      }
      else {
        uVar4 = this->ram_[uVar6 & 0x3ff];
      }
      goto LAB_002e2805;
    }
    break;
  case Write:
    if (((uVar5 < 0x2000 & (this->super_game_module_).replace_bios) == 1) ||
       ((0x1fff < (short)uVar5 & (this->super_game_module_).replace_ram) == 1)) {
      (this->super_game_module_).ram[uVar6] = *cycle->value;
      return (HalfCycles)WVar10.length_;
    }
    if (0x5fff < (short)uVar5) {
      this->ram_[uVar6 & 0x3ff] = *cycle->value;
      return (HalfCycles)WVar10.length_;
    }
    if ((0xffbf < uVar5 & this->is_megacart_) != 1) {
      return (HalfCycles)WVar10.length_;
    }
    puVar2 = (this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->cartridge_pages_[1] =
         puVar2 + (ulong)((uVar6 & 0x3f) << 0xe) %
                  (ulong)((long)(this->cartridge_).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    return (HalfCycles)WVar10.length_;
  case Input:
    uVar8 = uVar6 >> 5 & 7;
    if (uVar8 == 7) {
      *cycle->value =
           *(uint8_t *)
            (*(long *)((long)&(((this->joysticks_).
                                super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                              super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                              ._M_t + (ulong)(uVar6 & 2) * 4) + 0x40 +
            (ulong)this->joysticks_in_keypad_mode_);
      if ((~uVar6 & 0xfc) != 0) {
        return (HalfCycles)WVar10.length_;
      }
      Analyser::Dynamic::ConfidenceCounter::add_hit(&this->confidence_counter_);
      return (HalfCycles)WVar10.length_;
    }
    if (uVar8 == 5) {
      uVar11 = JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::
               operator->((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>
                           *)local_40);
      sVar7 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::read
                        ((TMS9918<(TI::TMS::Personality)0> *)local_40._8_8_,uVar6,
                         uVar11._M_t.
                         super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                         .super__Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false>.
                         _M_head_impl,sVar9);
      *cycle->value = (uint8_t)sVar7;
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_40);
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_40);
      bVar3 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line
                        ((TMS9918<(TI::TMS::Personality)0> *)local_40._8_8_);
      goto LAB_002e2861;
    }
    if ((char)uVar6 != 'R') goto LAB_002e2810;
    update_audio(this);
    uVar4 = GI::AY38910::Utility::read<GI::AY38910::AY38910<false>>(&this->ay_);
    goto LAB_002e2805;
  case Output:
    uVar8 = uVar6 >> 5 & 7;
    sVar9 = (size_t)uVar8;
    switch(uVar8) {
    case 4:
    case 6:
      this->joysticks_in_keypad_mode_ = uVar8 == 4;
      return (HalfCycles)WVar10.length_;
    case 5:
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_40);
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::write
                ((TMS9918<(TI::TMS::Personality)0> *)local_40._8_8_,uVar6,
                 (void *)(ulong)*cycle->value,sVar9);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_40);
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_40);
      bVar3 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line
                        ((TMS9918<(TI::TMS::Personality)0> *)local_40._8_8_);
      break;
    case 7:
      update_audio(this);
      TI::SN76489::write(&this->sn76489_,(uint)*cycle->value,__buf,sVar9);
      return (HalfCycles)WVar10.length_;
    default:
      if ((char)uVar6 == 'P') {
        update_audio(this);
        GI::AY38910::Utility::select_register<GI::AY38910::AY38910<false>>(&this->ay_,*cycle->value)
        ;
        return (HalfCycles)WVar10.length_;
      }
      uVar6 = uVar6 & 0xff;
      if (uVar6 == 0x51) {
        update_audio(this);
        GI::AY38910::Utility::write_data<GI::AY38910::AY38910<false>>(&this->ay_,*cycle->value);
        return (HalfCycles)WVar10.length_;
      }
      if (uVar6 == 0x53) {
        (this->super_game_module_).replace_ram = (bool)(*cycle->value & 1);
        return (HalfCycles)WVar10.length_;
      }
      if (uVar6 != 0x7f) {
        return (HalfCycles)WVar10.length_;
      }
      (this->super_game_module_).replace_bios = (*cycle->value & 2) == 0;
      return (HalfCycles)WVar10.length_;
    }
LAB_002e2861:
    CPU::Z80::ProcessorBase::set_non_maskable_interrupt_line
              (&(this->z80_).super_ProcessorBase,bVar3,(HalfCycles)0x0);
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_40);
    return (HalfCycles)WVar10.length_;
  }
  if ((this->super_game_module_).replace_bios == true) {
    uVar4 = (this->super_game_module_).ram[uVar6];
  }
  else {
    uVar4 = (this->bios_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
  }
LAB_002e2805:
  *cycle->value = uVar4;
  return (HalfCycles)(WrappedInt<HalfCycles>)WVar10.length_;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			// The SN76489 will use its ready line to trigger the Z80's wait, which will add
			// thirty-one (!) cycles when accessed. M1 cycles are extended by a single cycle.
			// This code works out the delay up front in order to simplify execution flow, though
			// technically this is a little duplicative.
			HalfCycles penalty(0);
			if(cycle.operation == CPU::Z80::PartialMachineCycle::Output && ((*cycle.address >> 5) & 7) == 7) {
				penalty = HalfCycles(62);
			} else if(cycle.operation == CPU::Z80::PartialMachineCycle::ReadOpcode) {
				penalty = HalfCycles(2);
			}
			const HalfCycles length = cycle.length + penalty;

			if(vdp_ += length) {
				z80_.set_non_maskable_interrupt_line(vdp_->get_interrupt_line());
			}
			time_since_sn76489_update_ += length;

			// Act only if necessary.
			if(cycle.is_terminal()) {
				uint16_t address = cycle.address ? *cycle.address : 0x0000;
				switch(cycle.operation) {
					case CPU::Z80::PartialMachineCycle::ReadOpcode:
						if(!address) pc_zero_accesses_++;
						[[fallthrough]];
					case CPU::Z80::PartialMachineCycle::Read:
						if(address < 0x2000) {
							if(super_game_module_.replace_bios) {
								*cycle.value = super_game_module_.ram[address];
							} else {
								*cycle.value = bios_[address];
							}
						} else if(super_game_module_.replace_ram && address < 0x8000) {
							*cycle.value = super_game_module_.ram[address];
						} else if(address >= 0x6000 && address < 0x8000) {
							*cycle.value = ram_[address & 1023];
						} else if(address >= 0x8000 && address <= cartridge_address_limit_) {
							if(is_megacart_ && address >= 0xffc0) {
								page_megacart(address);
							}
							*cycle.value = cartridge_pages_[(address >> 14)&1][address&0x3fff];
						} else {
							*cycle.value = 0xff;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Write:
						if(super_game_module_.replace_bios && address < 0x2000) {
							super_game_module_.ram[address] = *cycle.value;
						} else if(super_game_module_.replace_ram && address >= 0x2000 && address < 0x8000) {
							super_game_module_.ram[address] = *cycle.value;
						} else if(address >= 0x6000 && address < 0x8000) {
							ram_[address & 1023] = *cycle.value;
						} else if(is_megacart_ && address >= 0xffc0) {
							page_megacart(address);
						}
					break;

					case CPU::Z80::PartialMachineCycle::Input:
						switch((address >> 5) & 7) {
							case 5:
								*cycle.value = vdp_->read(address);
								z80_.set_non_maskable_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 7: {
								const std::size_t joystick_id = (address&2) >> 1;
								Joystick *joystick = static_cast<Joystick *>(joysticks_[joystick_id].get());
								if(joysticks_in_keypad_mode_) {
									*cycle.value = joystick->get_keypad_input();
								} else {
									*cycle.value = joystick->get_direction_input();
								}

								// Hitting exactly the recommended joypad input port is an indicator that
								// this really is a ColecoVision game. The BIOS won't do this when just waiting
								// to start a game (unlike accessing the VDP and SN).
								if((address&0xfc) == 0xfc) confidence_counter_.add_hit();
							} break;

							default:
								switch(address&0xff) {
									default: *cycle.value = 0xff; break;
									case 0x52:
										// Read AY data.
										update_audio();
										*cycle.value = GI::AY38910::Utility::read(ay_);
									break;
								}
							break;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Output: {
						const int eighth = (address >> 5) & 7;
						switch(eighth) {
							case 4: case 6:
								joysticks_in_keypad_mode_ = eighth == 4;
							break;

							case 5:
								vdp_->write(address, *cycle.value);
								z80_.set_non_maskable_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 7:
								update_audio();
								sn76489_.write(*cycle.value);
							break;

							default:
								// Catch Super Game Module accesses; it decodes more thoroughly.
								switch(address&0xff) {
									default: break;
									case 0x7f:
										super_game_module_.replace_bios = !((*cycle.value)&0x2);
									break;
									case 0x50:
										// Set AY address.
										update_audio();
										GI::AY38910::Utility::select_register(ay_, *cycle.value);
									break;
									case 0x51:
										// Set AY data.
										update_audio();
										GI::AY38910::Utility::write_data(ay_, *cycle.value);
									break;
									case 0x53:
										super_game_module_.replace_ram = !!((*cycle.value)&0x1);
									break;
								}
							break;
						}
					} break;

					default: break;
				}
			}

			return penalty;
		}